

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlnNtk.c
# Opt level: O3

void Wln_NtkCreateRefs(Wln_Ntk_t *p)

{
  uint uVar1;
  Wln_Vec_t *pWVar2;
  int *piVar3;
  anon_union_8_2_7a96f2af_for_Wln_Vec_t__2 *paVar4;
  long lVar5;
  int iVar6;
  anon_union_8_2_7a96f2af_for_Wln_Vec_t__2 *paVar7;
  long lVar8;
  int iVar9;
  anon_union_8_2_7a96f2af_for_Wln_Vec_t__2 *paVar10;
  
  uVar1 = (p->vTypes).nCap;
  if ((p->vRefs).nCap < (int)uVar1) {
    piVar3 = (p->vRefs).pArray;
    if (piVar3 == (int *)0x0) {
      piVar3 = (int *)malloc((long)(int)uVar1 << 2);
    }
    else {
      piVar3 = (int *)realloc(piVar3,(long)(int)uVar1 << 2);
    }
    (p->vRefs).pArray = piVar3;
    if (piVar3 == (int *)0x0) {
      __assert_fail("p->pArray",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                    ,0x215,"void Vec_IntGrow(Vec_Int_t *, int)");
    }
    (p->vRefs).nCap = uVar1;
  }
  if (0 < (int)uVar1) {
    memset((p->vRefs).pArray,0,(ulong)uVar1 * 4);
  }
  (p->vRefs).nSize = uVar1;
  iVar6 = (p->vTypes).nSize;
  if (1 < iVar6) {
    pWVar2 = p->vFanins;
    paVar4 = &pWVar2[1].field_2;
    lVar5 = 1;
    do {
      iVar9 = pWVar2[lVar5].nSize;
      if (0 < iVar9) {
        lVar8 = 0;
        paVar7 = paVar4;
        do {
          paVar10 = paVar7;
          if (2 < iVar9) {
            paVar10 = (anon_union_8_2_7a96f2af_for_Wln_Vec_t__2 *)
                      (pWVar2[lVar5].field_2.pArray[0] + lVar8);
          }
          uVar1 = paVar10->Array[0];
          if ((ulong)uVar1 != 0) {
            if (((int)uVar1 < 0) || ((p->vRefs).nSize <= (int)uVar1)) {
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                            ,0x1b8,"int *Vec_IntEntryP(Vec_Int_t *, int)");
            }
            piVar3 = (p->vRefs).pArray + uVar1;
            *piVar3 = *piVar3 + 1;
            iVar9 = pWVar2[lVar5].nSize;
          }
          lVar8 = lVar8 + 1;
          paVar7 = (anon_union_8_2_7a96f2af_for_Wln_Vec_t__2 *)((long)paVar7 + 4);
        } while (lVar8 < iVar9);
        iVar6 = (p->vTypes).nSize;
      }
      lVar5 = lVar5 + 1;
      paVar4 = paVar4 + 2;
    } while (lVar5 < iVar6);
  }
  return;
}

Assistant:

void Wln_NtkCreateRefs( Wln_Ntk_t * p )  
{
    int k, iObj, iFanin;
    Wln_NtkCleanRefs( p );
    Wln_NtkForEachObj( p, iObj )
        Wln_ObjForEachFanin( p, iObj, iFanin, k )
            Wln_ObjRefsInc( p, iFanin );
}